

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_inexact_to_exact(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  double dVar4;
  sexp local_50;
  double local_48;
  undefined8 uStack_40;
  sexp_gc_var_t local_30;
  
  local_50 = (sexp)0x43e;
  if (((ulong)z & 1) == 0) {
    if (((ulong)z & 2) != 0) {
LAB_00129a8c:
      psVar2 = sexp_type_exception(ctx,self,0xb,z);
      return psVar2;
    }
    sVar1 = z->tag;
    if (1 < sVar1 - 0xc) {
      if (sVar1 == 0xe) {
        local_30.var = &local_50;
        local_30.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_30;
        local_50 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
        psVar2 = sexp_inexact_to_exact(ctx,self,n_00,(z->value).type.name);
        (local_50->value).type.name = psVar2;
        psVar3 = sexp_inexact_to_exact(ctx,self,n_01,(z->value).type.cpl);
        (local_50->value).type.cpl = psVar3;
        psVar2 = (local_50->value).type.name;
        if ((((((ulong)psVar2 & 3) != 0) || (z = psVar2, psVar2->tag != 0x13)) &&
            ((((ulong)psVar3 & 3) != 0 || (z = psVar3, psVar3->tag != 0x13)))) &&
           (z = local_50, psVar3 == (sexp)&DAT_00000001)) {
          z = psVar2;
        }
        (ctx->value).context.saves = local_30.next;
      }
      else {
        if (sVar1 != 0xb) goto LAB_00129a8c;
        local_48 = (z->value).flonum;
        if (0x7fefffffffffffff < (ulong)ABS(local_48)) {
          psVar2 = sexp_xtype_exception(ctx,self,"exact: not a finite number",z);
          return psVar2;
        }
        uStack_40 = 0;
        dVar4 = trunc(local_48);
        if ((local_48 != dVar4) || (NAN(local_48) || NAN(dVar4))) {
          psVar2 = sexp_double_to_ratio_2(ctx,local_48);
          return psVar2;
        }
        if (4.611686018427388e+18 < ABS(local_48)) {
          psVar2 = sexp_double_to_bignum(ctx,local_48);
          return psVar2;
        }
        z = (sexp)((long)local_48 * 2 + 1);
      }
    }
  }
  return z;
}

Assistant:

sexp sexp_inexact_to_exact (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  sexp_gc_var1(res);
  if (sexp_exactp(z)) {
    res = z;
  }
#if SEXP_USE_FLONUMS
  else if (sexp_flonump(z)) {
    if (isinf(sexp_flonum_value(z)) || isnan(sexp_flonum_value(z))) {
      res = sexp_xtype_exception(ctx, self, "exact: not a finite number", z);
    } else if (sexp_flonum_value(z) != trunc(sexp_flonum_value(z))) {
#if SEXP_USE_RATIOS
      res = sexp_double_to_ratio_2(ctx, sexp_flonum_value(z));
#else
      res = sexp_xtype_exception(ctx, self, "exact: not an integer", z);
#endif
#if SEXP_USE_BIGNUMS
    } else if ((sexp_flonum_value(z) > (double)SEXP_MAX_FIXNUM)
               || sexp_flonum_value(z) < (double)SEXP_MIN_FIXNUM) {
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(z));
#endif
    } else {
      res = sexp_make_fixnum((sexp_sint_t)sexp_flonum_value(z));
    }
  }
#endif
#if SEXP_USE_COMPLEX
  else if (sexp_complexp(z)) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
    sexp_complex_real(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_real(z));
    sexp_complex_imag(res) = sexp_inexact_to_exact(ctx, self, 1, sexp_complex_imag(z));
    if (sexp_exceptionp(sexp_complex_real(res)))
      res = sexp_complex_real(res);
    else if (sexp_exceptionp(sexp_complex_imag(res)))
      res = sexp_complex_imag(res);
    else if (sexp_complex_imag(res) == SEXP_ZERO)
      res = sexp_complex_real(res);
    sexp_gc_release1(ctx);
  }
#endif
  else {
    res = sexp_type_exception(ctx, self, SEXP_FLONUM, z);
  }
  return res;
}